

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btcp.c
# Opt level: O2

void nn_btcp_handler(nn_fsm *self,int src,int type,void *srcptr)

{
  int *self_00;
  uint uVar1;
  nn_list_item *it;
  char *pcVar2;
  undefined8 uVar3;
  ulong uVar4;
  
  if (*(int *)&self[1].ctx == 2) {
    if (src == 1) {
      if (0xfffffffd < type - 9U) {
        return;
      }
      nn_backtrace_print();
      pcVar2 = "type == NN_USOCK_SHUTDOWN || type == NN_USOCK_STOPPED";
      uVar3 = 0x11d;
    }
    else if (src == 3) {
      srcptr = self;
      if (type == 1) {
LAB_001b203a:
        nn_free(srcptr);
        return;
      }
      nn_backtrace_print();
      pcVar2 = "type == NN_BTCP_TYPE_LISTEN_ERR";
      uVar3 = 0x116;
    }
    else if (src == 2) {
      if (type == 0x85b9) {
        nn_list_erase((nn_list *)&self[8].stopped.src,(nn_list_item *)((long)srcptr + 0x720));
        nn_atcp_term((nn_atcp *)srcptr);
        goto LAB_001b203a;
      }
      if (type == 0x85b8) {
        nn_atcp_stop((nn_atcp *)srcptr);
        return;
      }
      if (type != 0x85b7) {
        nn_backtrace_print();
        uVar1 = *(uint *)&self[1].ctx;
        pcVar2 = "Unexpected action";
        uVar4 = 2;
        uVar3 = 0x135;
        goto LAB_001b21a3;
      }
      if (self[8].stopped.fsm == (nn_fsm *)srcptr) {
        self_00 = &self[8].stopped.src;
        it = nn_list_end((nn_list *)self_00);
        nn_list_insert((nn_list *)self_00,(nn_list_item *)((long)srcptr + 0x720),it);
        self[8].stopped.fsm = (nn_fsm *)0x0;
        nn_btcp_start_accepting((nn_btcp *)self);
        return;
      }
      nn_backtrace_print();
      pcVar2 = "btcp->atcp == atcp";
      uVar3 = 0x126;
    }
    else {
      nn_backtrace_print();
      pcVar2 = "src == NN_BTCP_SRC_ATCP";
      uVar3 = 0x122;
    }
  }
  else {
    if (*(int *)&self[1].ctx != 1) {
      nn_backtrace_print();
      uVar1 = *(uint *)&self[1].ctx;
      pcVar2 = "Unexpected state";
      uVar4 = (ulong)(uint)src;
      uVar3 = 0x13c;
LAB_001b21a3:
      fprintf(_stderr,"%s: state=%d source=%d action=%d (%s:%d)\n",pcVar2,(ulong)uVar1,uVar4,
              (ulong)(uint)type,
              "/workspace/llm4binary/github/license_c_cmakelists/pietern[P]goestools/vendor/nanomsg/src/transports/tcp/btcp.c"
              ,uVar3);
      goto LAB_001b2162;
    }
    if (src == -2) {
      if (type == -2) {
        *(undefined4 *)&self[1].ctx = 2;
        return;
      }
      nn_backtrace_print();
      pcVar2 = "type == NN_FSM_START";
      uVar3 = 0x10c;
    }
    else {
      nn_backtrace_print();
      pcVar2 = "src == NN_FSM_ACTION";
      uVar3 = 0x10b;
    }
  }
  fprintf(_stderr,"Assertion failed: %s (%s:%d)\n",pcVar2,
          "/workspace/llm4binary/github/license_c_cmakelists/pietern[P]goestools/vendor/nanomsg/src/transports/tcp/btcp.c"
          ,uVar3);
LAB_001b2162:
  fflush(_stderr);
  nn_err_abort();
}

Assistant:

static void nn_btcp_handler (struct nn_fsm *self, int src, int type,
    void *srcptr)
{
    struct nn_btcp *btcp;
    struct nn_atcp *atcp;

    btcp = nn_cont (self, struct nn_btcp, fsm);

    switch (btcp->state) {

/******************************************************************************/
/*  IDLE state.                                                               */
/******************************************************************************/
    case NN_BTCP_STATE_IDLE:
        nn_assert (src == NN_FSM_ACTION);
        nn_assert (type == NN_FSM_START);
        btcp->state = NN_BTCP_STATE_ACTIVE;
        return;

/******************************************************************************/
/*  ACTIVE state.                                                             */
/*  The execution is yielded to the atcp state machine in this state.         */
/******************************************************************************/
    case NN_BTCP_STATE_ACTIVE:
        if (src == NN_BTCP_SRC_BTCP) {   
            nn_assert (type == NN_BTCP_TYPE_LISTEN_ERR);
            nn_free (btcp);
            return;
        }

        if (src == NN_BTCP_SRC_USOCK) {
            /*  usock object cleaning up */
            nn_assert (type == NN_USOCK_SHUTDOWN || type == NN_USOCK_STOPPED);
            return;
        }

        /*  All other events come from child atcp objects. */
        nn_assert (src == NN_BTCP_SRC_ATCP);
        atcp = (struct nn_atcp*) srcptr;
        switch (type) {
        case NN_ATCP_ACCEPTED:
            nn_assert (btcp->atcp == atcp) ;
            nn_list_insert (&btcp->atcps, &atcp->item,
                nn_list_end (&btcp->atcps));
            btcp->atcp = NULL;
            nn_btcp_start_accepting (btcp);
            return;
        case NN_ATCP_ERROR:
            nn_atcp_stop (atcp);
            return;
        case NN_ATCP_STOPPED:
            nn_list_erase (&btcp->atcps, &atcp->item);
            nn_atcp_term (atcp);
            nn_free (atcp);
            return;
        default:
            nn_fsm_bad_action (btcp->state, src, type);
        }

/******************************************************************************/
/*  Invalid state.                                                            */
/******************************************************************************/
    default:
        nn_fsm_bad_state (btcp->state, src, type);
    }
}